

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O0

void gb_write_mbc_1(MemoryBankController *mc,uint16_t address,uint8_t data)

{
  uint local_24;
  int write_addr;
  int ram_bank;
  int offset;
  uint8_t data_local;
  uint16_t address_local;
  MemoryBankController *mc_local;
  
  if ((address < 0x2000) || (0x3fff < address)) {
    if ((address < 0x4000) || (0x5fff < address)) {
      if ((address < 0x6000) || (0x7fff < address)) {
        if ((address < 0xa000) || (0xbfff < address)) {
          if ((address < 0xe000) || (0xfdff < address)) {
            gb_common_writes(mc,address,data);
          }
          else {
            mc->memory[address] = data;
            (*mc->write)(mc,address + 0xe000,data);
          }
        }
        else if ((mc->ram_enabled & 1U) != 0) {
          if (mc->banking_mode == Banking_Mode_ROM) {
            local_24 = 0;
          }
          else {
            local_24 = (uint)mc->banking_register_2;
          }
          mc->ram[(int)((address - 0xa000) + (local_24 & mc->ram_bank_mask) * 0x2000)] = data;
        }
      }
      else {
        gb_set_banking_mode(mc,data);
      }
    }
    else {
      gb_set_ram_bank_number(mc,data);
    }
  }
  else {
    gb_set_rom_bank_number(mc,data,'\x1f');
  }
  return;
}

Assistant:

void gb_write_mbc_1(MemoryBankController* mc, uint16_t address, uint8_t data) {

    if (address >= 0x2000 && address <= 0x3FFF) {
        gb_set_rom_bank_number(mc, data, 0x1F);
        return;
    } 
    
    if (address >= 0x4000 && address <= 0x5FFF) {
        gb_set_ram_bank_number(mc, data);
        return;
    } 
    
    if (address >= 0x6000 && address <= 0x7FFF) {
        gb_set_banking_mode(mc, data);
        return;
    } 

    if (address >= 0xA000 && address <= 0xBFFF) {
        if(mc->ram_enabled) {
            int offset = address - 0xA000;
            int ram_bank = mc->banking_mode == Banking_Mode_ROM ? 0 : (mc->banking_register_2);
            int write_addr = offset + (ram_bank & mc->ram_bank_mask) * RAM_BANK_SIZE;
            mc->ram[write_addr] = data;
        }
        return;
    }
    
    if (address >= 0xE000 && address < 0xFE00) {
        mc->memory[address] = data;
        mc->write(mc, (uint16_t) (address - 0x2000), data);
        return;
    }

    gb_common_writes(mc, address, data);
}